

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:476:40),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:476:40),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  ExceptionOr<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> depResult;
  ExceptionOrValue local_5c0;
  undefined8 *local_460;
  long *plStack_458;
  ExceptionOr<int> local_450;
  Exception local_2e8;
  Exception local_188;
  
  local_5c0.exception.ptr.isSet = false;
  local_460 = (undefined8 *)0x0;
  plStack_458 = (long *)0x0;
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_5c0);
  uVar5 = local_5c0.exception.ptr.field_1.value.context.ptr.ptr;
  uVar4 = local_5c0.exception.ptr.field_1.value.description.content.size_;
  uVar3 = local_5c0.exception.ptr.field_1.value.description.content.ptr;
  uVar2 = local_5c0.exception.ptr.field_1.value.ownFile.content.size_;
  uVar1 = local_5c0.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_5c0.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_5c0.exception.ptr.field_1 + 0x50);
    local_2e8.ownFile.content.ptr = local_5c0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_2e8.ownFile.content.size_ = local_5c0.exception.ptr.field_1.value.ownFile.content.size_;
    local_2e8.ownFile.content.disposer =
         local_5c0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_5c0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_5c0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_2e8.file = local_5c0.exception.ptr.field_1.value.file;
    local_2e8.line = local_5c0.exception.ptr.field_1.value.line;
    local_2e8.type = local_5c0.exception.ptr.field_1.value.type;
    local_2e8.description.content.ptr =
         local_5c0.exception.ptr.field_1.value.description.content.ptr;
    local_2e8.description.content.size_ =
         local_5c0.exception.ptr.field_1.value.description.content.size_;
    local_2e8.description.content.disposer =
         local_5c0.exception.ptr.field_1.value.description.content.disposer;
    local_5c0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_5c0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_5c0.exception.ptr.field_1.value.context.ptr.disposer;
    local_2e8.context.ptr.ptr = local_5c0.exception.ptr.field_1.value.context.ptr.ptr;
    local_5c0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,__src,0x104);
    local_188.ownFile.content.ptr = (char *)uVar1;
    local_188.ownFile.content.size_ = uVar2;
    local_188.ownFile.content.disposer =
         local_5c0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_188.file = local_5c0.exception.ptr.field_1.value.file;
    local_188.line = local_5c0.exception.ptr.field_1.value.line;
    local_188.type = local_5c0.exception.ptr.field_1.value.type;
    local_188.description.content.ptr = (char *)uVar3;
    local_188.description.content.size_ = uVar4;
    local_188.description.content.disposer =
         local_5c0.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_5c0.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = (Context *)uVar5;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_450.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_450.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar1
    ;
    local_450.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar2;
    local_450.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_5c0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_450.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_5c0.exception.ptr.field_1.value.file;
    local_450.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_5c0.exception.ptr.field_1._32_8_;
    local_450.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar3;
    local_450.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar4;
    local_450.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_5c0.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_450.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_5c0.exception.ptr.field_1.value.context.ptr.disposer;
    local_450.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar5;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_450.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_450.value.ptr.isSet = false;
    Exception::~Exception(&local_188);
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_450);
    if (local_450.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_450.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    Exception::~Exception(&local_2e8);
  }
  else if (plStack_458 != (long *)0x0) {
    if ((*(int *)((long)plStack_458 + 0xc) != 0x7b) && (Debug::minSeverity < 3)) {
      local_188.ownFile.content.ptr = (char *)CONCAT44(local_188.ownFile.content.ptr._4_4_,0x7b);
      Debug::log<char_const(&)[33],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x1dd,ERROR,"\"failed: expected \" \"(123) == (i->i)\", 123, i->i",
                 (char (*) [33])"failed: expected (123) == (i->i)",(int *)&local_188,
                 (int *)((long)plStack_458 + 0xc));
    }
    local_450.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_450.value.ptr.isSet = true;
    local_450.value.ptr.field_1.value = 0x1c8;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_450);
    if (local_450.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_450.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
  }
  plVar6 = plStack_458;
  if (plStack_458 != (long *)0x0) {
    plStack_458 = (long *)0x0;
    (**(code **)*local_460)(local_460,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  if (local_5c0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_5c0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }